

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::GoBitmap::emit(GoBitmap *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  SwitchIf *in_R9;
  undefined1 local_48 [8];
  string yych;
  bool *readCh_local;
  uint32_t ind_local;
  OutputFile *o_local;
  GoBitmap *this_local;
  
  yych.field_2._8_8_ = readCh;
  output_hgo_abi_cxx11_
            ((string *)local_48,(re2c *)o,(OutputFile *)(ulong)ind,(uint32_t)readCh,
             (bool *)this->hgo,in_R9);
  pOVar1 = OutputFile::ws(o,"if (");
  poVar2 = Opt::operator->((Opt *)&opts);
  pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yybm);
  pOVar1 = OutputFile::ws(pOVar1,"[");
  pOVar1 = OutputFile::wu32(pOVar1,this->bitmap->i);
  pOVar1 = OutputFile::ws(pOVar1,"+");
  pOVar1 = OutputFile::wstring(pOVar1,(string *)local_48);
  OutputFile::ws(pOVar1,"] & ");
  poVar2 = Opt::operator->((Opt *)&opts);
  if ((poVar2->yybmHexTable & 1U) == 0) {
    OutputFile::wu32(o,this->bitmap->m);
  }
  else {
    OutputFile::wu32_hex(o,this->bitmap->m);
  }
  OutputFile::ws(o,") {\n");
  output_goto(o,ind + 1,(bool *)yych.field_2._8_8_,(label_t)(this->bitmap_state->label).value);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  if (this->lgo != (SwitchIf *)0x0) {
    SwitchIf::emit(this->lgo,o,ind,(bool *)yych.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GoBitmap::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	std::string yych = output_hgo (o, ind, readCh, hgo);
	o.ws("if (").wstring(opts->yybm).ws("[").wu32(bitmap->i).ws("+").wstring(yych).ws("] & ");
	if (opts->yybmHexTable)
	{
		o.wu32_hex(bitmap->m);
	}
	else
	{
		o.wu32(bitmap->m);
	}
	o.ws(") {\n");
	output_goto (o, ind + 1, readCh, bitmap_state->label);
	o.wind(ind).ws("}\n");
	if (lgo != NULL)
	{
		lgo->emit (o, ind, readCh);
	}
}